

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

string_type * __thiscall
jsoncons::basic_json_options_common<char>::neginf_to_str_abi_cxx11_
          (basic_json_options_common<char> *this)

{
  long in_RSI;
  string_type *in_RDI;
  string_type *s;
  
  if ((*(ushort *)(in_RSI + 8) >> 5 & 1) == 0) {
    if ((*(ushort *)(in_RSI + 8) >> 4 & 1) == 0) {
      std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0xb0));
    }
    else {
      std::__cxx11::string::string((string *)in_RDI);
      std::__cxx11::string::push_back((char)in_RDI);
      std::__cxx11::string::append((string *)in_RDI);
    }
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0xb0));
  }
  return in_RDI;
}

Assistant:

string_type neginf_to_str() const
    {
        if (enable_neginf_to_str_)
        {
            return neginf_to_str_;
        }
        else if (enable_inf_to_str_)
        {
            string_type s;
            s.push_back('-');
            s.append(inf_to_str_);
            return s;
        }
        else
        {
            return neginf_to_str_; // empty string
        }
    }